

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128x2.cc
# Opt level: O3

int aead_aegis_128x2_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int reason;
  int line;
  uint8_t padded_nonce [16];
  uint8_t tag [16];
  undefined1 local_120 [15] [16];
  
  if (nonce_len < 0x11) {
    if (ctx->tag_len == in_tag_len) {
      local_120[0] = (undefined1  [16])0x0;
      if (nonce_len != 0) {
        memcpy(local_120,nonce,nonce_len);
      }
      vpmovsxwq_avx2(ZEXT816(0x10100000100));
      halt_baddata();
    }
    reason = 0x65;
    line = 0x178;
  }
  else {
    reason = 0x79;
    line = 0x174;
  }
  ERR_put_error(0x1e,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128x2.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128x2_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                        const uint8_t *nonce, size_t nonce_len,
                                        const uint8_t *in, size_t in_len,
                                        const uint8_t *in_tag,
                                        size_t in_tag_len, const uint8_t *ad,
                                        size_t ad_len) {
  const struct aead_aegis_128x2_ctx *aegis_ctx =
      (struct aead_aegis_128x2_ctx *)&ctx->state;

  return aegis_128x2_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                                 in_len, in_tag, in_tag_len, ad, ad_len,
                                 ctx->tag_len);
}